

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O3

void dirNexBank(void)

{
  char *badValueMessage;
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  aint *paVar3;
  aint i;
  ulong uVar4;
  aint bankNum;
  undefined8 uStack_28;
  
  if (!nex.canAppend) {
    Error("[SAVENEX] NEX file is not open",(char *)0x0,SUPPRESS);
    return;
  }
  uStack_28 = in_RAX;
  while (badValueMessage = lp,
        iVar2 = ParseExpressionNoSyntaxError(&lp,(aint *)((long)&uStack_28 + 4)), iVar2 != 0) {
    uVar4 = (ulong)uStack_28._4_4_;
    if (0x67 < uStack_28._4_4_ - 8) {
      paVar3 = nexBankOrder;
      uVar4 = 0;
      while (*paVar3 != uStack_28._4_4_) {
        uVar4 = uVar4 + 1;
        paVar3 = (aint *)((uint *)paVar3 + 1);
        if (uVar4 == 8) goto LAB_00117ec0;
      }
    }
    bVar1 = saveBank((aint)uVar4,uStack_28._4_4_,false);
    if (!bVar1) {
      return;
    }
    bVar1 = comma(&lp);
    if (!bVar1) {
      return;
    }
  }
LAB_00117ec0:
  Error("[SAVENEX] expected bank number 0..111",badValueMessage,SUPPRESS);
  return;
}

Assistant:

static void dirNexBank() {
	if (!nex.canAppend) {
		Error("[SAVENEX] NEX file is not open", NULL, SUPPRESS);
		return;
	}
	do {
		aint bankNum, bankIndex;
		char *nextLp = lp;
		if (!ParseExpressionNoSyntaxError(lp, bankNum)
			|| (bankIndex = getNexBankIndex(bankNum)) < 0) {
			Error("[SAVENEX] expected bank number 0..111", nextLp, SUPPRESS);
			break;
		}
		if (!saveBank(bankIndex, bankNum)) break;
	} while (comma(lp));
}